

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMeshSolution.cpp
# Opt level: O3

void __thiscall
TPZMeshSolution::Execute
          (TPZMeshSolution *this,TPZVec<double> *x,TPZVec<double> *f,TPZFMatrix<double> *df)

{
  TPZManVector<double,_3> *qsi;
  double *pdVar1;
  TPZCompEl *pTVar2;
  long lVar3;
  TPZGeoEl **ppTVar4;
  int iVar5;
  ulong uVar6;
  int d;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  TPZManVector<double,_10> dsol;
  TPZManVector<double,_10> sol;
  TPZManVector<double,_3> local_148;
  TPZManVector<double,_10> local_110;
  TPZManVector<double,_10> local_a0;
  
  local_148.super_TPZVec<double>.fStore = (double *)0x0;
  local_148.super_TPZVec<double>.fNElements = 0;
  local_148.super_TPZVec<double>.fNAlloc = 0;
  local_148.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01819f98;
  uVar7 = x->fNElements;
  if ((long)uVar7 < 4) {
    local_148.super_TPZVec<double>.fStore = local_148.fExtAlloc;
    if ((long)uVar7 < 1) goto LAB_01273a41;
  }
  else {
    local_148.super_TPZVec<double>.fStore =
         (double *)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8);
    local_148.super_TPZVec<double>.fNAlloc = uVar7;
  }
  pdVar1 = x->fStore;
  uVar6 = 0;
  do {
    local_148.super_TPZVec<double>.fStore[uVar6] = pdVar1[uVar6];
    uVar6 = uVar6 + 1;
  } while (uVar7 != uVar6);
LAB_01273a41:
  qsi = &this->fLastLoc;
  local_148.super_TPZVec<double>.fNElements = uVar7;
  TPZGeoMesh::FindElement
            (this->fMesh->fReference,&local_148.super_TPZVec<double>,&qsi->super_TPZVec<double>,
             &this->fGeoElIndex,this->fDimension);
  ppTVar4 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                      (&(this->fMesh->fReference->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,
                       this->fGeoElIndex);
  pTVar2 = (*ppTVar4)->fReference;
  TPZManVector<double,_10>::TPZManVector(&local_a0,1);
  TPZManVector<double,_10>::TPZManVector(&local_110,3);
  (**(code **)(*(long *)pTVar2 + 0x1b0))(pTVar2,qsi,this->fSolutionVarindex,&local_a0);
  (**(code **)(*(long *)pTVar2 + 0x1b0))(pTVar2,qsi,this->fGradVarindex,&local_110);
  iVar5 = this->fNumSolutions;
  if (0 < iVar5) {
    lVar3 = (df->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    lVar10 = 3;
    if (lVar3 < 3) {
      lVar10 = lVar3;
    }
    lVar11 = 0;
    lVar8 = 0;
    lVar9 = 0;
    do {
      f->fStore[lVar9] = local_a0.super_TPZVec<double>.fStore[lVar9];
      if (0 < (int)(uint)lVar10) {
        uVar7 = 0;
        do {
          if ((lVar3 <= (long)uVar7) ||
             ((df->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          *(undefined8 *)((long)df->fElem + uVar7 * 8 + lVar11 * lVar3) =
               *(undefined8 *)((long)local_110.super_TPZVec<double>.fStore + uVar7 * 8 + lVar8);
          uVar7 = uVar7 + 1;
        } while (((uint)lVar10 & 0x7fffffff) != uVar7);
        iVar5 = this->fNumSolutions;
      }
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 0x18;
      lVar11 = lVar11 + 8;
    } while (lVar9 < iVar5);
  }
  TPZManVector<double,_10>::~TPZManVector(&local_110);
  TPZManVector<double,_10>::~TPZManVector(&local_a0);
  TPZManVector<double,_3>::~TPZManVector(&local_148);
  return;
}

Assistant:

void TPZMeshSolution::Execute(const TPZVec<REAL> &x, TPZVec<STATE> &f, TPZFMatrix<STATE> &df)
{
    TPZManVector<REAL,3> xcopy(x);
    fMesh->Reference()->FindElement(xcopy, fLastLoc, fGeoElIndex, fDimension);
    TPZGeoEl *gel = fMesh->Reference()->Element(fGeoElIndex);
    TPZCompEl *cel = gel->Reference();
    TPZManVector<STATE> sol(1), dsol(3);
    cel->Solution(fLastLoc,fSolutionVarindex,sol);
    cel->Solution(fLastLoc,fGradVarindex,dsol);
    int maxd = 3;
    if (df.Rows() < 3) {
        maxd = df.Rows();
    }
    for (int is=0; is<fNumSolutions; is++) {
        f[is] = sol[is];
        for (int d=0; d<maxd; d++) {
            df(d,is) = dsol[is*3+d];
        }
    }
}